

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void __thiscall
SFFile::ApplyGeneratorsToRegion
          (SFFile *this,SFGenComposite *gen,SFSample *sfsamp,Renderer *song,Sample *sp)

{
  uint uVar1;
  ushort uVar2;
  WORD WVar3;
  uint uVar4;
  DWORD DVar5;
  uint uVar6;
  DWORD DVar7;
  double dVar8;
  
  sp->type = '\x02';
  uVar1 = sfsamp->Start;
  DVar7 = sfsamp->End;
  uVar4 = (int)gen->startAddrsOffset + uVar1 + gen->startAddrsCoarseOffset * 0x8000;
  if ((int)uVar4 < (int)uVar1) {
    uVar4 = uVar1;
  }
  DVar5 = (int)gen->endAddrsOffset + DVar7 + gen->endAddrsCoarseOffset * 0x8000;
  if ((int)DVar7 < (int)DVar5) {
    DVar5 = DVar7;
  }
  uVar6 = gen->startLoopAddrsCoarseOffset * 0x8000 +
          (int)gen->startLoopAddrsOffset + sfsamp->StartLoop;
  if ((int)uVar6 < (int)uVar4) {
    uVar6 = uVar4;
  }
  sp->loop_start = uVar6;
  DVar7 = gen->endLoopAddrsCoarseOffset * 0x8000 + (int)gen->endLoopAddrsOffset + sfsamp->EndLoop;
  if ((int)DVar5 < (int)DVar7) {
    DVar7 = DVar5;
  }
  sp->loop_start = (uVar6 - uVar4) * 0x1000;
  sp->loop_end = (DVar7 - uVar4) * 0x1000;
  sp->data_length = (DVar5 - uVar4) * 0x1000;
  sp->data = sfsamp->InMemoryData + ((long)(int)uVar4 - (ulong)uVar1);
  uVar2 = gen->overridingRootKey;
  if (0x7f < uVar2) {
    uVar2 = (ushort)sfsamp->OriginalPitch;
  }
  sp->scale_note = uVar2;
  dVar8 = exp2((double)(int)(short)uVar2 * 0.08333333333333333);
  sp->root_freq = (float)(dVar8 * 8175.798947309669);
  sp->sample_rate = sfsamp->SampleRate;
  sp->key_group = gen->exclusiveClass;
  if ((ushort)gen->keynum < 0x80) {
    sp->scale_note = gen->keynum;
    sp->scale_factor = 0;
  }
  else if (gen->scaleTuning < 0) {
    sp->scale_factor = 0x400;
    sp->scale_note = 0x3c;
  }
  else {
    sp->scale_factor = (WORD)((uint)((int)gen->scaleTuning << 10) / 100);
  }
  sp->panning = gen->pan;
  (sp->envelope).sf2.delay_vol = gen->delayVolEnv;
  (sp->envelope).sf2.attack_vol = gen->attackVolEnv;
  (sp->envelope).sf2.hold_vol = gen->holdVolEnv;
  (sp->envelope).sf2.decay_vol = gen->decayVolEnv;
  (sp->envelope).sf2.sustain_vol = gen->sustainVolEnv;
  (sp->envelope).sf2.release_vol = gen->releaseVolEnv;
  WVar3 = 100;
  if (gen->sampleModes != 1) {
    WVar3 = (ushort)(gen->sampleModes == 3) * 4 + 0x20;
  }
  sp->modes = WVar3;
  sp->tune = gen->coarseTune * 100 + gen->fineTune;
  sp->velocity = (SBYTE)gen->velocity;
  sp->initial_attenuation = (float)(int)gen->initialAttenuation;
  return;
}

Assistant:

void SFFile::ApplyGeneratorsToRegion(SFGenComposite *gen, SFSample *sfsamp, Renderer *song, Sample *sp)
{
	sp->type = INST_SF2;

	// Set loop and sample points
	int start, end;
	start = gen->startAddrsOffset + gen->startAddrsCoarseOffset * 32768;
	end = gen->endAddrsOffset + gen->endAddrsCoarseOffset * 32768;
	start = MAX<int>(sfsamp->Start, sfsamp->Start + start);
	end = MIN<int>(sfsamp->End, sfsamp->End + end);
	sp->loop_start = MAX<int>(start, sfsamp->StartLoop + gen->startLoopAddrsOffset + gen->startLoopAddrsCoarseOffset * 32768);
	sp->loop_end = MIN<int>(end, sfsamp->EndLoop + gen->endLoopAddrsOffset + gen->endLoopAddrsCoarseOffset * 32768);

	sp->loop_start = (sp->loop_start - start) << FRACTION_BITS;
	sp->loop_end = (sp->loop_end - start) << FRACTION_BITS;
	sp->data_length = (end - start) << FRACTION_BITS;
	sp->data = sfsamp->InMemoryData + start - sfsamp->Start;
	if (gen->overridingRootKey >= 0 && gen->overridingRootKey <= 127)
	{
		sp->scale_note = gen->overridingRootKey;
	}
	else
	{
		sp->scale_note = sfsamp->OriginalPitch;
	}
	sp->root_freq = note_to_freq(sp->scale_note);
	sp->sample_rate = sfsamp->SampleRate;
	sp->key_group = gen->exclusiveClass;

	// Set key scaling
	if (gen->keynum >= 0 && gen->keynum <= 127)
	{
		sp->scale_note = gen->keynum;
		sp->scale_factor = 0;
	}
	else if (gen->scaleTuning >= 0)
	{
		sp->scale_factor = gen->scaleTuning * 1024 / 100;
		// Does the root key also serve as the scale key? Assuming it does here.
	}
	else
	{
		sp->scale_factor = 1024;
		sp->scale_note = 60;
	}

	// Set panning
	sp->panning = gen->pan;

	// Set volume envelope
	sp->envelope.sf2.delay_vol = gen->delayVolEnv;
	sp->envelope.sf2.attack_vol = gen->attackVolEnv;
	sp->envelope.sf2.hold_vol = gen->holdVolEnv;
	sp->envelope.sf2.decay_vol = gen->decayVolEnv;
	sp->envelope.sf2.sustain_vol = gen->sustainVolEnv;
	sp->envelope.sf2.release_vol = gen->releaseVolEnv;

	// Set sample modes
	if (gen->sampleModes == 1)
	{
		sp->modes = PATCH_LOOPEN | PATCH_SUSTAIN | PATCH_NO_SRELEASE;
	}
	else if (gen->sampleModes == 3)
	{
		sp->modes = PATCH_LOOPEN | PATCH_SUSTAIN;
	}
	else
	{
		sp->modes = PATCH_SUSTAIN;
	}

	// Set tuning (in cents)
	sp->tune = gen->coarseTune * 100 + gen->fineTune;

	sp->velocity = (SBYTE)gen->velocity;
	sp->initial_attenuation = gen->initialAttenuation;
}